

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O2

Id dxil_spv::build_accumulate_offsets(Impl *impl,Id *ids,uint count)

{
  Id IVar1;
  Id IVar2;
  Builder *pBVar3;
  Operation *this;
  ulong uVar4;
  
  IVar2 = 0;
  for (uVar4 = 0; count != uVar4; uVar4 = uVar4 + 1) {
    IVar1 = IVar2;
    if ((ids[uVar4] != 0) && (IVar1 = ids[uVar4], IVar2 != 0)) {
      pBVar3 = Converter::Impl::builder(impl);
      IVar1 = spv::Builder::makeUintType(pBVar3,0x20);
      this = Converter::Impl::allocate(impl,OpIAdd,IVar1);
      Operation::add_id(this,IVar2);
      Operation::add_id(this,ids[uVar4]);
      Converter::Impl::add(impl,this,false);
      IVar1 = this->id;
    }
    IVar2 = IVar1;
  }
  if (IVar2 == 0) {
    pBVar3 = Converter::Impl::builder(impl);
    IVar2 = spv::Builder::makeUintConstant(pBVar3,0,false);
    return IVar2;
  }
  return IVar2;
}

Assistant:

static spv::Id build_accumulate_offsets(Converter::Impl &impl, const spv::Id *ids, unsigned count)
{
	spv::Id accumulated_id = 0;
	for (unsigned i = 0; i < count; i++)
	{
		if (!ids[i])
			continue;

		if (!accumulated_id)
		{
			accumulated_id = ids[i];
		}
		else
		{
			auto *add_op = impl.allocate(spv::OpIAdd, impl.builder().makeUintType(32));
			add_op->add_id(accumulated_id);
			add_op->add_id(ids[i]);
			impl.add(add_op);
			accumulated_id = add_op->id;
		}
	}

	if (!accumulated_id)
		accumulated_id = impl.builder().makeUintConstant(0);

	return accumulated_id;
}